

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool do_last_general(DisasContext_conflict1 *s,arg_rpr_esz *a,_Bool before)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  TCGv_i64 arg;
  TCGv_i64 ret;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    arg = do_last_scalar(s,a->esz,a->pg,a->rn,before);
    ret = cpu_reg_aarch64(s,a->rd);
    tcg_gen_mov_i64_aarch64(tcg_ctx,ret,arg);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg + (long)tcg_ctx));
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool do_last_general(DisasContext *s, arg_rpr_esz *a, bool before)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 val = do_last_scalar(s, a->esz, a->pg, a->rn, before);
        tcg_gen_mov_i64(tcg_ctx, cpu_reg(s, a->rd), val);
        tcg_temp_free_i64(tcg_ctx, val);
    }
    return true;
}